

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O2

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::extract_demand_from_not_empty_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,demand_t *dest)

{
  size_t sVar1;
  size_t sVar2;
  demand_t *o;
  
  sVar1 = (this->m_queue).m_max_size;
  sVar2 = (this->m_queue).m_size;
  o = details::limited_preallocated_demand_queue::front(&this->m_queue);
  demand_t::operator=(dest,o);
  details::limited_preallocated_demand_queue::pop_front(&this->m_queue);
  impl::msg_tracing_helpers::mchain_tracing_enabled_base::trace_extracted_demand
            (&this->super_mchain_tracing_enabled_base,&this->super_abstract_message_chain_t,dest);
  if (sVar1 == sVar2) {
    std::condition_variable::notify_all();
  }
  return msg_extracted;
}

Assistant:

extraction_status_t
		extract_demand_from_not_empty_queue(
			demand_t & dest )
			{
				// If queue was full then someone can wait on it.
				const bool queue_was_full = m_queue.is_full();
				dest = std::move( m_queue.front() );
				m_queue.pop_front();

				this->trace_extracted_demand( *this, dest );

				if( queue_was_full )
					m_overflow_cond.notify_all();

				return extraction_status_t::msg_extracted;
			}